

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyString.cpp
# Opt level: O0

PropertyString *
Js::PropertyString::New(StaticType *type,PropertyRecord *propertyRecord,Recycler *recycler)

{
  Recycler *alloc;
  PropertyString *this;
  TrackAllocData local_48;
  Recycler *local_20;
  Recycler *recycler_local;
  PropertyRecord *propertyRecord_local;
  StaticType *type_local;
  
  local_20 = recycler;
  recycler_local = (Recycler *)propertyRecord;
  propertyRecord_local = (PropertyRecord *)type;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/PropertyString.cpp"
             ,0x14);
  alloc = Memory::Recycler::TrackAllocInfo(recycler,&local_48);
  this = (PropertyString *)new<Memory::Recycler>(0x40,alloc,0x744a10);
  PropertyString(this,(StaticType *)propertyRecord_local,(PropertyRecord *)recycler_local);
  return this;
}

Assistant:

PropertyString* PropertyString::New(StaticType* type, const Js::PropertyRecord* propertyRecord, Recycler *recycler)
    {
        return RecyclerNewZ(recycler, PropertyString, type, propertyRecord);
    }